

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,ArrayPtr<const_char> expected)

{
  bool bVar1;
  size_t sVar2;
  Fault local_c0;
  Fault f_1;
  undefined1 local_b0 [8];
  DebugComparison<kj::ArrayPtr<const_char>_&,_kj::ArrayPtr<const_char>_&> _kjCondition_1;
  ArrayPtr<const_char> prefix;
  Fault local_68;
  Fault f;
  size_t local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  Input *this_local;
  ArrayPtr<const_char> expected_local;
  
  expected_local.ptr = (char *)expected.size_;
  this_local = (Input *)expected.ptr;
  _kjCondition._32_8_ = this;
  local_58 = kj::ArrayPtr<const_char>::size(&this->wrapped);
  local_50 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception = (Exception *)kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  kj::_::DebugExpression<unsigned_long>::operator>=
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_48,&local_50,(unsigned_long *)&f
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x24a,FAILED,"wrapped.size() >= expected.size()","_kjCondition,",
               (DebugComparison<unsigned_long,_unsigned_long> *)local_48);
    kj::_::Debug::Fault::fatal(&local_68);
  }
  sVar2 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  join_0x00000010_0x00000000_ = kj::ArrayPtr<const_char>::first(&this->wrapped,sVar2);
  f_1.exception =
       (Exception *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (ArrayPtr<const_char> *)&_kjCondition_1.result);
  kj::_::DebugExpression<kj::ArrayPtr<char_const>&>::operator==
            ((DebugComparison<kj::ArrayPtr<const_char>_&,_kj::ArrayPtr<const_char>_&> *)local_b0,
             (DebugExpression<kj::ArrayPtr<char_const>&> *)&f_1,(ArrayPtr<const_char> *)&this_local)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<char_const>&,kj::ArrayPtr<char_const>&>&,char_const(&)[34]>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x24d,FAILED,"prefix == expected",
               "_kjCondition,\"Unexpected input in JSON message.\"",
               (DebugComparison<kj::ArrayPtr<const_char>_&,_kj::ArrayPtr<const_char>_&> *)local_b0,
               (char (*) [34])"Unexpected input in JSON message.");
    kj::_::Debug::Fault::fatal(&local_c0);
  }
  sVar2 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  advance(this,sVar2);
  return;
}

Assistant:

void consume(kj::ArrayPtr<const char> expected) {
    KJ_REQUIRE(wrapped.size() >= expected.size());

    auto prefix = wrapped.first(expected.size());
    KJ_REQUIRE(prefix == expected, "Unexpected input in JSON message.");

    advance(expected.size());
  }